

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall
Js::FunctionBody::FunctionBody
          (FunctionBody *this,ScriptContext *scriptContext,char16 *displayName,
          uint displayNameLength,uint displayShortNameOffset,uint nestedCount,
          Utf8SourceInfo *utf8SourceInfo,uint uFunctionNumber,uint uScriptId,
          LocalFunctionId functionId,Attributes attributes,FunctionBodyFlags flags)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  FunctionEntryPointInfo *pFVar4;
  SRCINFO *this_00;
  SourceContextInfo *pSVar5;
  undefined4 *puVar6;
  ThreadContext *this_01;
  Recycler *pRVar7;
  SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *ptr;
  ProxyEntryPointInfo *pPVar8;
  TrackAllocData local_a8;
  CriticalSection *local_80;
  CriticalSection *syncObj;
  nullptr_t local_70;
  nullptr_t local_68;
  nullptr_t local_60;
  nullptr_t local_58;
  nullptr_t local_50;
  nullptr_t local_48;
  uint local_3c;
  uint local_38;
  uint nestedCount_local;
  uint displayShortNameOffset_local;
  uint displayNameLength_local;
  char16 *displayName_local;
  ScriptContext *scriptContext_local;
  FunctionBody *this_local;
  
  local_3c = nestedCount;
  local_38 = displayShortNameOffset;
  nestedCount_local = displayNameLength;
  _displayShortNameOffset_local = displayName;
  displayName_local = (char16 *)scriptContext;
  scriptContext_local = (ScriptContext *)this;
  ParseableFunctionInfo::ParseableFunctionInfo
            (&this->super_ParseableFunctionInfo,scriptContext->CurrentThunk,nestedCount,functionId,
             utf8SourceInfo,scriptContext,uFunctionNumber,displayName,displayNameLength,
             displayShortNameOffset,attributes,flags);
  (this->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01de0570;
  CompactCounters<Js::FunctionBody,_Js::FunctionBody::CounterFields>::CompactCounters
            (&this->counters,this);
  local_48 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::ByteBlock>::WriteBarrierPtr(&this->byteCodeBlock,&local_48);
  local_50 = (nullptr_t)0x0;
  Memory::
  WriteBarrierPtr<Js::SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>_>
  ::WriteBarrierPtr(&this->entryPoints,&local_50);
  local_58 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<void>_>::WriteBarrierPtr
            (&this->m_constTable,&local_58);
  local_60 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<void_*>::WriteBarrierPtr(&this->inlineCaches,&local_60);
  InlineCachePointerArray<Js::PolymorphicInlineCache>::InlineCachePointerArray
            (&this->polymorphicInlineCaches);
  local_68 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<int>::WriteBarrierPtr(&this->cacheIdToPropertyIdMap,&local_68);
  local_70 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<unsigned_char>::WriteBarrierPtr(&this->m_inlineCacheTypes,&local_70);
  this->m_DEBUG_executionCount = 0;
  this->m_nativeEntryPointIsInterpreterThunk = false;
  this->regAllocStoreCount = 0;
  this->regAllocLoadCount = 0;
  this->callCountStats = 0;
  SourceInfo::SourceInfo(&this->m_sourceInfo);
  this->m_uScriptId = uScriptId;
  this->m_iProfileSession = -1;
  this->m_envDepth = 0xffff;
  this->m_argUsedForBranch = 0;
  this->profiledLdLenCount = 0;
  this->profiledLdElemCount = 0;
  this->profiledStElemCount = 0;
  this->profiledCallSiteCount = 0;
  this->profiledArrayCallSiteCount = 0;
  this->profiledDivOrRemCount = 0;
  this->profiledSwitchCount = 0;
  this->profiledReturnTypeCount = 0;
  this->profiledSlotCount = 0;
  this->m_tag31 = true;
  this->m_hasFinally = false;
  this->hasScopeObject = false;
  this->hasCachedScopePropIds = false;
  *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0xfffffffe | 1;
  *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0xfffffffd;
  *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0xfffffffb;
  *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0xfffffff7;
  *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0xffffffef;
  *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0xffffffbf;
  *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0xffffff7f;
  *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0xfffffeff;
  *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0xfffffdff;
  *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0xfffffbff;
  *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0xffffbfff;
  *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0xffff7fff;
  *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0xfffeffff;
  *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0xfffdffff;
  *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0xfffbffff | 0x40000;
  *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0xfff7ffff;
  *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0xffefffff;
  *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0xffdfffff;
  *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0xffbfffff;
  *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0xff7fffff;
  *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0xfeffffff;
  *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0xfdffffff;
  *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0xfbffffff | 0x4000000;
  *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0xf7ffffff;
  *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0xefffffff;
  *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0xdfffffff;
  *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0xbfffffff;
  *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0x7fffffff;
  *(ushort *)&this->field_0x17c = *(ushort *)&this->field_0x17c & 0xfffe | 1;
  *(ushort *)&this->field_0x17c = *(ushort *)&this->field_0x17c & 0xfffd;
  *(ushort *)&this->field_0x17c = *(ushort *)&this->field_0x17c & 0xfffb;
  *(ushort *)&this->field_0x17c = *(ushort *)&this->field_0x17c & 0xfff7;
  *(ushort *)&this->field_0x17c = *(ushort *)&this->field_0x17c & 0xffef;
  *(ushort *)&this->field_0x17c = *(ushort *)&this->field_0x17c & 0xffdf;
  *(ushort *)&this->field_0x17c = *(ushort *)&this->field_0x17c & 0xffbf;
  *(ushort *)&this->field_0x17c = *(ushort *)&this->field_0x17c & 0xff7f;
  *(ushort *)&this->field_0x17c = *(ushort *)&this->field_0x17c & 0xfeff;
  *(ushort *)&this->field_0x17c = *(ushort *)&this->field_0x17c & 0xfdff;
  *(ushort *)&this->field_0x17c = *(ushort *)&this->field_0x17c & 0xf7ff;
  *(ushort *)&this->field_0x17c = *(ushort *)&this->field_0x17c & 0xefff;
  this->bailOnMisingProfileCount = '\0';
  this->bailOnMisingProfileRejitCount = '\0';
  this->inlineDepth = '\0';
  FunctionExecutionStateMachine::FunctionExecutionStateMachine(&this->executionState);
  this->m_depth = 0;
  this->loopInterpreterLimit = DAT_01eace48;
  this->debuggerScopeIndex = 0;
  this->savedPolymorphicCacheState = 0;
  this->byteCodeCache = (Type)0x0;
  Memory::WriteBarrierPtr<Js::FunctionEntryPointInfo>::WriteBarrierPtr
            (&this->defaultFunctionEntryPointInfo);
  syncObj = (CriticalSection *)0x0;
  Memory::WriteBarrierPtr<Js::DynamicProfileInfo>::WriteBarrierPtr
            (&this->dynamicProfileInfo,&syncObj);
  this->savedInlinerVersion = '\0';
  this->savedImplicitCallsFlags = ImplicitCall_HasNoInfo;
  this->m_asmJsTotalLoopCount = 0;
  SetCountField(this,ConstantCount,1);
  pFVar4 = (FunctionEntryPointInfo *)FunctionProxy::GetDefaultEntryPointInfo((FunctionProxy *)this);
  SetDefaultFunctionEntryPointInfo(this,pFVar4,InterpreterStackFrame::DelayDynamicInterpreterThunk);
  *(ushort *)&(this->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 =
       *(ushort *)&(this->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 & 0xfffd | 2;
  if (utf8SourceInfo != (Utf8SourceInfo *)0x0) {
    TVar1 = this->m_uScriptId;
    this_00 = Utf8SourceInfo::GetSrcInfo(utf8SourceInfo);
    pSVar5 = Memory::WriteBarrierPtr<SourceContextInfo>::operator->(&this_00->sourceContextInfo);
    if (TVar1 != pSVar5->sourceContextId) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x280,
                                  "(!utf8SourceInfo || m_uScriptId == utf8SourceInfo->GetSrcInfo()->sourceContextInfo->sourceContextId)"
                                  ,
                                  "!utf8SourceInfo || m_uScriptId == utf8SourceInfo->GetSrcInfo()->sourceContextInfo->sourceContextId"
                                 );
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
  }
  this_01 = ScriptContext::GetThreadContext((ScriptContext *)displayName_local);
  local_80 = ThreadContext::GetFunctionBodyLock(this_01);
  pRVar7 = ScriptContext::GetRecycler
                     ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_a8,
             (type_info *)
             &SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>*,JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>,Js::DefaultContainerLockPolicy,CriticalSection>
              ::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
             ,0x284);
  pRVar7 = Memory::Recycler::TrackAllocInfo(pRVar7,&local_a8);
  ptr = (SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
         *)new<Memory::Recycler>(0x38,pRVar7,0x43c4b0);
  pRVar7 = ScriptContext::GetRecycler
                     ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext);
  SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>*,JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>,Js::DefaultContainerLockPolicy,CriticalSection>
  ::SynchronizableList<Memory::Recycler*>
            ((SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>*,JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>,Js::DefaultContainerLockPolicy,CriticalSection>
              *)ptr,pRVar7,local_80);
  Memory::
  WriteBarrierPtr<Js::SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>_>
  ::operator=(&this->entryPoints,ptr);
  pFVar4 = GetDefaultFunctionEntryPointInfo(this);
  AddEntryPointToEntryPointList(this,pFVar4);
  pPVar8 = FunctionProxy::GetDefaultEntryPointInfo((FunctionProxy *)this);
  if (pPVar8->jsMethod == (Type)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x288,"(this->GetDefaultEntryPointInfo()->jsMethod != nullptr)",
                                "this->GetDefaultEntryPointInfo()->jsMethod != nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  InitDisableInlineApply(this);
  InitDisableInlineSpread(this);
  return;
}

Assistant:

FunctionBody::FunctionBody(ScriptContext* scriptContext, const char16* displayName, uint displayNameLength, uint displayShortNameOffset, uint nestedCount,
        Utf8SourceInfo* utf8SourceInfo, uint uFunctionNumber, uint uScriptId,
        Js::LocalFunctionId  functionId, FunctionInfo::Attributes attributes, FunctionBodyFlags flags
#ifdef PERF_COUNTERS
        , bool isDeserializedFunction
#endif
        ) :
        ParseableFunctionInfo(scriptContext->CurrentThunk, nestedCount, functionId, utf8SourceInfo, scriptContext, uFunctionNumber, displayName, displayNameLength, displayShortNameOffset, attributes, flags),
        counters(this),
        m_uScriptId(uScriptId),
        cleanedUp(false),
        sourceInfoCleanedUp(false),
        profiledLdLenCount(0),
        profiledLdElemCount(0),
        profiledStElemCount(0),
        profiledCallSiteCount(0),
        profiledArrayCallSiteCount(0),
        profiledDivOrRemCount(0),
        profiledSwitchCount(0),
        profiledReturnTypeCount(0),
        profiledSlotCount(0),
        m_isFuncRegistered(false),
        m_isFuncRegisteredToDiag(false),
        m_hasBailoutInstrInJittedCode(false),
        m_depth(0),
        inlineDepth(0),
        m_pendingLoopHeaderRelease(false),
        hasCachedScopePropIds(false),
        m_argUsedForBranch(0),
        m_envDepth((uint16)-1),
        loopInterpreterLimit(CONFIG_FLAG(LoopInterpretCount)),
        savedPolymorphicCacheState(0),
        debuggerScopeIndex(0),
        m_hasFinally(false),
#if ENABLE_PROFILE_INFO
        dynamicProfileInfo(nullptr),
#endif
        savedInlinerVersion(0),
#if ENABLE_NATIVE_CODEGEN
        savedImplicitCallsFlags(ImplicitCall_HasNoInfo),
#endif
        hasExecutionDynamicProfileInfo(false),
        m_hasAllNonLocalReferenced(false),
        m_hasSetIsObject(false),
        m_hasFunExprNameReference(false),
        m_CallsEval(false),
        m_ChildCallsEval(false),
        m_hasReferenceableBuiltInArguments(false),
        m_isParamAndBodyScopeMerged(true),
        m_firstFunctionObject(true),
        m_inlineCachesOnFunctionObject(false),
        m_hasDoneAllNonLocalReferenced(false),
        m_hasFunctionCompiledSent(false),
        byteCodeCache(nullptr),
        m_hasLocalClosureRegister(false),
        m_hasParamClosureRegister(false),
        m_hasLocalFrameDisplayRegister(false),
        m_hasEnvRegister(false),
        m_hasThisRegisterForEventHandler(false),
        m_hasFirstInnerScopeRegister(false),
        m_hasFuncExprScopeRegister(false),
        m_hasFirstTmpRegister(false),
        m_hasActiveReference(false),
        m_tag31(true),
        m_tag32(true),
        m_tag33(true),
        m_nativeEntryPointUsed(false),
        hasDoneLoopBodyCodeGen(false),
        bailOnMisingProfileCount(0),
        bailOnMisingProfileRejitCount(0),
        byteCodeBlock(nullptr),
        entryPoints(nullptr),
        m_constTable(nullptr),
        inlineCaches(nullptr),
        cacheIdToPropertyIdMap(nullptr),
        wasCalledFromLoop(false),
        hasScopeObject(false),
        hasNestedLoop(false),
        recentlyBailedOutOfJittedLoopBody(false),
        m_isAsmJsScheduledForFullJIT(false),
        m_asmJsTotalLoopCount(0)
        //
        // Even if the function does not require any locals, we must always have "R0" to propagate
        // a return value.  By enabling this here, we avoid unnecessary conditionals during execution.
        //
#ifdef IR_VIEWER
        ,m_isIRDumpEnabled(false)
        ,m_irDumpBaseObject(nullptr)
#endif /* IR_VIEWER */
        , m_isFromNativeCodeModule(false)
        , hasHotLoop(false)
        , m_isPartialDeserializedFunction(false)
#if DBG
        , m_isSerialized(false)
#endif
#ifdef PERF_COUNTERS
        , m_isDeserializedFunction(isDeserializedFunction)
#endif
#if DBG
        , m_DEBUG_executionCount(0)
        , m_nativeEntryPointIsInterpreterThunk(false)
        , m_canDoStackNestedFunc(false)
        , m_inlineCacheTypes(nullptr)
        , m_iProfileSession(-1)
#endif
#if ENABLE_DEBUG_CONFIG_OPTIONS
        , regAllocLoadCount(0)
        , regAllocStoreCount(0)
        , callCountStats(0)
#endif
    {
        SetCountField(CounterFields::ConstantCount, 1);

        this->SetDefaultFunctionEntryPointInfo((FunctionEntryPointInfo*) this->GetDefaultEntryPointInfo(), DefaultEntryThunk);
        this->m_hasBeenParsed = true;

#ifdef PERF_COUNTERS
        if (isDeserializedFunction)
        {
            PERF_COUNTER_INC(Code, DeserializedFunctionBody);
        }
#endif
        Assert(!utf8SourceInfo || m_uScriptId == utf8SourceInfo->GetSrcInfo()->sourceContextInfo->sourceContextId);

        // Sync entryPoints changes to etw rundown lock
        CriticalSection* syncObj = scriptContext->GetThreadContext()->GetFunctionBodyLock();
        this->entryPoints = RecyclerNew(this->m_scriptContext->GetRecycler(), FunctionEntryPointList, this->m_scriptContext->GetRecycler(), syncObj);

        this->AddEntryPointToEntryPointList(this->GetDefaultFunctionEntryPointInfo());

        Assert(this->GetDefaultEntryPointInfo()->jsMethod != nullptr);

        InitDisableInlineApply();
        InitDisableInlineSpread();
    }